

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O0

string * ApprovalTests::HelpMessages::getMisconfiguredBuildHelp(string *fileName)

{
  string *in_RDI;
  string *in_stack_00000048;
  string helpMessage;
  allocator *replaceWith;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  replaceWith = &local_31;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_30,
             "* Welcome to Approval Tests.\n*\n* There seems to be a problem with your build configuration.\n* We cannot find the test source file at:\n*   [fileName]\n*\n* For details on how to fix this, please visit:\n* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/TroubleshootingMisconfiguredBuild.md\n*\n* For advanced users only:\n* If you believe you have reached this message in error, you can bypass\n* the check by calling ApprovalTestNamer::setCheckBuildConfig(false);\n"
             ,replaceWith);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  topAndTailHelpMessage(in_stack_00000048);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff78,"[fileName]",(allocator *)&stack0xffffffffffffff77);
  StringUtils::replaceAll(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(string *)replaceWith)
  ;
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string HelpMessages::getMisconfiguredBuildHelp(const std::string& fileName)
    {
        std::string helpMessage = R"(* Welcome to Approval Tests.
*
* There seems to be a problem with your build configuration.
* We cannot find the test source file at:
*   [fileName]
*
* For details on how to fix this, please visit:
* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/TroubleshootingMisconfiguredBuild.md
*
* For advanced users only:
* If you believe you have reached this message in error, you can bypass
* the check by calling ApprovalTestNamer::setCheckBuildConfig(false);
)";
        return StringUtils::replaceAll(
            topAndTailHelpMessage(helpMessage), "[fileName]", fileName);
    }